

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int unixRead(sqlite3_file *id,void *pBuf,int amt,sqlite3_int64 offset)

{
  sqlite3_io_methods *psVar1;
  int iVar2;
  uint uVar3;
  __off64_t _Var4;
  int *piVar5;
  uint *puVar6;
  uint uVar7;
  void *pvVar8;
  size_t __n;
  int local_40;
  
  psVar1 = id[10].pMethods;
  if ((long)psVar1 - offset != 0 && offset <= (long)psVar1) {
    if (amt + offset <= (long)psVar1) {
      memcpy(pBuf,(void *)((long)&(id[0xd].pMethods)->iVersion + offset),(long)amt);
      return 0;
    }
    iVar2 = (int)((long)psVar1 - offset);
    __n = (size_t)iVar2;
    memcpy(pBuf,(void *)((long)&(id[0xd].pMethods)->iVersion + offset),__n);
    pBuf = (void *)((long)pBuf + __n);
    amt = amt - iVar2;
    offset = offset + __n;
  }
  local_40 = 0;
  pvVar8 = pBuf;
  uVar7 = amt;
  do {
    while( true ) {
      _Var4 = lseek64(*(int *)&id[3].pMethods,offset,0);
      if (_Var4 < 0) {
        puVar6 = (uint *)__errno_location();
        uVar7 = *puVar6;
        *(uint *)&id[4].pMethods = uVar7;
        if (amt == 0xffffffff) {
          return 0;
        }
        goto LAB_00123d10;
      }
      uVar3 = (*aSyscall[8].pCurrent)((ulong)*(uint *)&id[3].pMethods,pvVar8,(long)(int)uVar7);
      if (uVar7 - uVar3 == 0) goto LAB_00123cda;
      if (-1 < (int)uVar3) break;
      piVar5 = __errno_location();
      if (*piVar5 != 4) {
        *(int *)&id[4].pMethods = *piVar5;
        local_40 = 0;
        uVar7 = uVar3;
        goto LAB_00123cda;
      }
    }
    if (uVar3 == 0) {
      uVar7 = 0;
LAB_00123cda:
      uVar7 = uVar7 + local_40;
      if (amt - uVar7 == 0) {
        return 0;
      }
      if (-1 < (int)uVar7) {
        *(undefined4 *)&id[4].pMethods = 0;
        memset((void *)((long)pBuf + (ulong)uVar7),0,(long)(int)(amt - uVar7));
        return 0x20a;
      }
      uVar7 = *(uint *)&id[4].pMethods;
LAB_00123d10:
      if ((uVar7 < 0x23) && ((0x400000060U >> ((ulong)uVar7 & 0x3f) & 1) != 0)) {
        return 0x210a;
      }
      return 0x10a;
    }
    offset = offset + (ulong)(uVar3 & 0x7fffffff);
    local_40 = local_40 + uVar3;
    pvVar8 = (void *)((long)pvVar8 + (ulong)(uVar3 & 0x7fffffff));
    uVar7 = uVar7 - uVar3;
  } while( true );
}

Assistant:

static int unixRead(
  sqlite3_file *id,
  void *pBuf,
  int amt,
  sqlite3_int64 offset
){
  unixFile *pFile = (unixFile *)id;
  int got;
  assert( id );
  assert( offset>=0 );
  assert( amt>0 );

  /* If this is a database file (not a journal, super-journal or temp
  ** file), the bytes in the locking range should never be read or written. */
#if 0
  assert( pFile->pPreallocatedUnused==0
       || offset>=PENDING_BYTE+512
       || offset+amt<=PENDING_BYTE
  );
#endif

#if SQLITE_MAX_MMAP_SIZE>0
  /* Deal with as much of this read request as possible by transfering
  ** data from the memory mapping using memcpy().  */
  if( offset<pFile->mmapSize ){
    if( offset+amt <= pFile->mmapSize ){
      memcpy(pBuf, &((u8 *)(pFile->pMapRegion))[offset], amt);
      return SQLITE_OK;
    }else{
      int nCopy = pFile->mmapSize - offset;
      memcpy(pBuf, &((u8 *)(pFile->pMapRegion))[offset], nCopy);
      pBuf = &((u8 *)pBuf)[nCopy];
      amt -= nCopy;
      offset += nCopy;
    }
  }
#endif

  got = seekAndRead(pFile, offset, pBuf, amt);
  if( got==amt ){
    return SQLITE_OK;
  }else if( got<0 ){
    /* pFile->lastErrno has been set by seekAndRead().
    ** Usually we return SQLITE_IOERR_READ here, though for some
    ** kinds of errors we return SQLITE_IOERR_CORRUPTFS.  The
    ** SQLITE_IOERR_CORRUPTFS will be converted into SQLITE_CORRUPT
    ** prior to returning to the application by the sqlite3ApiExit()
    ** routine.
    */
    switch( pFile->lastErrno ){
      case ERANGE:
      case EIO:
#ifdef ENXIO
      case ENXIO:
#endif
#ifdef EDEVERR
      case EDEVERR:
#endif
        return SQLITE_IOERR_CORRUPTFS;
    }
    return SQLITE_IOERR_READ;
  }else{
    storeLastErrno(pFile, 0);   /* not a system error */
    /* Unread parts of the buffer must be zero-filled */
    memset(&((char*)pBuf)[got], 0, amt-got);
    return SQLITE_IOERR_SHORT_READ;
  }
}